

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O3

void Gia_ManCollectReached
               (char *pStr,Vec_Int_t *vStaTrans,int iState,Vec_Int_t *vReached,Vec_Int_t *vVisited,
               int TravId)

{
  int *piVar1;
  
  if (iState == 0) {
    if (vVisited->nSize < 1) goto LAB_007a505f;
    piVar1 = vVisited->pArray;
  }
  else {
    if (((byte)pStr[iState] - 0x28 < 3) || (pStr[iState] == 0x7c)) {
      __assert_fail("iState == 0 || !Gia_SymbSpecial(pStr[iState])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                    ,0xb0,
                    "void Gia_ManCollectReached(char *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if ((iState < 0) || (vVisited->nSize <= iState)) {
LAB_007a505f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar1 = vVisited->pArray + (uint)iState;
  }
  if (*piVar1 != TravId) {
    vReached->nSize = 0;
    Gia_ManPrintReached_rec(pStr,vStaTrans,iState + 1,vReached,vVisited,TravId);
    return;
  }
  __assert_fail("Vec_IntEntry(vVisited, iState) != TravId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                ,0xb1,
                "void Gia_ManCollectReached(char *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
               );
}

Assistant:

void Gia_ManCollectReached( char * pStr, Vec_Int_t * vStaTrans, int iState, Vec_Int_t * vReached, Vec_Int_t * vVisited, int TravId )
{
    assert( iState == 0 || !Gia_SymbSpecial(pStr[iState]) );
    assert( Vec_IntEntry(vVisited, iState) != TravId );
    Vec_IntClear( vReached );
    Gia_ManPrintReached_rec( pStr, vStaTrans, iState + 1, vReached, vVisited, TravId );
}